

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pairwise_tests.cpp
# Opt level: O1

int C_x_iutest_x_PairwiseTest_TestSuiteInstantiationRegister(void)

{
  pointer pcVar1;
  UnitTest *pUVar2;
  string *psVar3;
  ParamTestSuiteInfo<PairwiseTest> *pPVar4;
  undefined1 local_78 [32];
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pUVar2 = iutest::UnitTest::instance();
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"PairwiseTest","");
  psVar3 = iutest::detail::package_name_server<iuTest_TestSuitePackage>::getname__abi_cxx11_();
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + psVar3->_M_string_length);
  pPVar4 = iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<PairwiseTest>
                     (&pUVar2->m_param_testsuite_holder,(string *)local_78,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"C","");
  local_78._0_8_ = s_C_x_iutest_x_PairwiseTest_EvalGenerator_;
  local_78._8_8_ = s_C_x_iutest_x_PairwiseTest_ParamGenerator__abi_cxx11_;
  local_78._16_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pairwise_tests.cpp"
  ;
  local_78._24_4_ = 0x8b;
  std::
  vector<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest>::Functor>,std::allocator<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest>::Functor>>>
  ::emplace_back<std::__cxx11::string&,iutest::detail::ParamTestSuiteInfo<PairwiseTest>::Functor>
            ((vector<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest>::Functor>,std::allocator<std::pair<std::__cxx11::string,iutest::detail::ParamTestSuiteInfo<PairwiseTest>::Functor>>>
              *)&pPVar4->m_instantiation,&local_38,(Functor *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

IUTEST_P(PairwiseTest2, Num)
{
    const PairwiseTest2Tuple param = GetParam();
    mtx[::iutest::tuples::get<0>(param)][::iutest::tuples::get<1>(param)] = true;
}